

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_pressure.cpp
# Opt level: O3

void __thiscall
spvtools::opt::RegisterLiveness::ComputeLoopRegisterPressure
          (RegisterLiveness *this,Loop *loop,RegionRegisterLiveness *loop_reg_pressure)

{
  RegionRegisterLivenessMap *pRVar1;
  uint uVar2;
  Op opcode;
  _Hash_node_base *p_Var3;
  IRContext *this_00;
  uint32_t uVar4;
  int32_t iVar5;
  RegionRegisterLiveness *__ht;
  const_iterator cVar6;
  BasicBlock *pBVar7;
  ulong uVar8;
  long lVar9;
  LiveSet *__range2;
  Instruction *insn;
  undefined8 *puVar10;
  Instruction *pIVar11;
  __hashtable *__h;
  __node_base _Var12;
  _Hash_node_base *p_Var13;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  seen_insn;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  exit_blocks;
  uint32_t local_bc;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_b8;
  RegisterLiveness *local_b0;
  Loop *local_a8;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_a0;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  RegionRegisterLiveness::Clear(loop_reg_pressure);
  local_b0 = this;
  __ht = Get(this,loop->loop_header_);
  if (__ht != loop_reg_pressure) {
    std::
    _Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_assign_elements<std::_Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&>
              ((_Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)loop_reg_pressure,
               (_Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)__ht);
  }
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_a8 = loop;
  Loop::GetExitBlocks(loop,(unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                            *)&local_68);
  if (local_68._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    pRVar1 = &local_b0->block_pressure_;
    _Var12._M_nxt = local_68._M_before_begin._M_nxt;
    do {
      local_a0._M_buckets =
           (__buckets_ptr)
           CONCAT44(local_a0._M_buckets._4_4_,*(undefined4 *)&_Var12._M_nxt[1]._M_nxt);
      cVar6 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&pRVar1->_M_h,(key_type_conflict *)&local_a0);
      lVar9 = (long)cVar6.
                    super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_false>
                    ._M_cur + 0x10;
      if (cVar6.
          super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_false>
          ._M_cur == (__node_type *)0x0) {
        lVar9 = 0;
      }
      local_a0._M_buckets = (__buckets_ptr)&loop_reg_pressure->live_out_;
      for (puVar10 = *(undefined8 **)(lVar9 + 0x10); puVar10 != (undefined8 *)0x0;
          puVar10 = (undefined8 *)*puVar10) {
        std::
        _Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<spvtools::opt::Instruction*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::Instruction*,false>>>>
                  ((_Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)&loop_reg_pressure->live_out_,puVar10 + 1,&local_a0);
      }
      _Var12._M_nxt = (_Var12._M_nxt)->_M_nxt;
    } while (_Var12._M_nxt != (_Hash_node_base *)0x0);
  }
  local_a0._M_buckets = &local_a0._M_single_bucket;
  local_a0._M_bucket_count = 1;
  local_a0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a0._M_element_count = 0;
  local_a0._M_rehash_policy._M_max_load_factor = 1.0;
  local_a0._M_rehash_policy._M_next_resize = 0;
  local_a0._M_single_bucket = (__node_base_ptr)0x0;
  p_Var13 = (loop_reg_pressure->live_out_)._M_h._M_before_begin._M_nxt;
  if (p_Var13 != (_Hash_node_base *)0x0) {
    do {
      pIVar11 = (Instruction *)p_Var13[1]._M_nxt;
      RegionRegisterLiveness::AddRegisterClass(loop_reg_pressure,pIVar11);
      uVar4 = 0;
      if (pIVar11->has_result_id_ == true) {
        uVar4 = Instruction::GetSingleWordOperand(pIVar11,(uint)pIVar11->has_type_id_);
      }
      local_bc = uVar4;
      local_b8 = &local_a0;
      std::
      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                (&local_a0,
                 (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&local_bc,&local_b8);
      p_Var13 = p_Var13->_M_nxt;
    } while (p_Var13 != (_Hash_node_base *)0x0);
  }
  p_Var13 = (loop_reg_pressure->live_in_)._M_h._M_before_begin._M_nxt;
  if (p_Var13 != (_Hash_node_base *)0x0) {
    do {
      pIVar11 = (Instruction *)p_Var13[1]._M_nxt;
      uVar4 = 0;
      if (pIVar11->has_result_id_ == true) {
        uVar4 = Instruction::GetSingleWordOperand(pIVar11,(uint)pIVar11->has_type_id_);
      }
      if (local_a0._M_buckets[(ulong)uVar4 % local_a0._M_bucket_count] != (__node_base_ptr)0x0) {
        p_Var3 = local_a0._M_buckets[(ulong)uVar4 % local_a0._M_bucket_count]->_M_nxt;
        uVar2 = *(uint *)&p_Var3[1]._M_nxt;
        while (uVar4 != uVar2) {
          p_Var3 = p_Var3->_M_nxt;
          if ((p_Var3 == (_Hash_node_base *)0x0) ||
             (uVar2 = *(uint *)&p_Var3[1]._M_nxt,
             (ulong)uVar2 % local_a0._M_bucket_count != (ulong)uVar4 % local_a0._M_bucket_count))
          goto LAB_005c12f2;
        }
        RegionRegisterLiveness::AddRegisterClass(loop_reg_pressure,pIVar11);
        uVar4 = 0;
        if (pIVar11->has_result_id_ == true) {
          uVar4 = Instruction::GetSingleWordOperand(pIVar11,(uint)pIVar11->has_type_id_);
        }
        local_bc = uVar4;
        local_b8 = &local_a0;
        std::
        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                  (&local_a0,
                   (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)&local_bc,&local_b8);
      }
LAB_005c12f2:
      p_Var13 = p_Var13->_M_nxt;
    } while (p_Var13 != (_Hash_node_base *)0x0);
  }
  loop_reg_pressure->used_registers_ = 0;
  p_Var13 = (local_a8->loop_basic_blocks_)._M_h._M_before_begin._M_nxt;
  if (p_Var13 != (_Hash_node_base *)0x0) {
    pRVar1 = &local_b0->block_pressure_;
    do {
      uVar4 = *(uint32_t *)&p_Var13[1]._M_nxt;
      this_00 = local_b0->context_;
      if ((this_00->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
        IRContext::BuildCFG(this_00);
      }
      pBVar7 = CFG::block((this_00->cfg_)._M_t.
                          super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
                          .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl,uVar4);
      local_b8 = (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)CONCAT44(local_b8._4_4_,uVar4);
      cVar6 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&pRVar1->_M_h,(key_type_conflict *)&local_b8);
      if (cVar6.
          super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_false>
          ._M_cur == (__node_type *)0x0) {
        __assert_fail("live_inout != nullptr && \"Basic block not processed\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp"
                      ,0x142,
                      "void spvtools::opt::RegisterLiveness::ComputeLoopRegisterPressure(const Loop &, RegionRegisterLiveness *) const"
                     );
      }
      uVar8 = *(ulong *)((long)cVar6.
                               super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_false>
                               ._M_cur + 0x80);
      if (*(ulong *)((long)cVar6.
                           super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_false>
                           ._M_cur + 0x80) < loop_reg_pressure->used_registers_) {
        uVar8 = loop_reg_pressure->used_registers_;
      }
      loop_reg_pressure->used_registers_ = uVar8;
      for (pIVar11 = (pBVar7->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                     super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
          pIVar11 != &(pBVar7->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
          pIVar11 = (pIVar11->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_) {
        opcode = pIVar11->opcode_;
        if ((((opcode != OpPhi) && (opcode != OpUndef)) && (pIVar11->has_result_id_ != false)) &&
           ((iVar5 = spvOpcodeIsConstant(opcode), iVar5 == 0 && (pIVar11->opcode_ != OpLabel)))) {
          uVar8 = 0;
          if (pIVar11->has_result_id_ == true) {
            uVar4 = Instruction::GetSingleWordOperand(pIVar11,(uint)pIVar11->has_type_id_);
            uVar8 = (ulong)uVar4;
          }
          if (local_a0._M_buckets[uVar8 % local_a0._M_bucket_count] != (__node_base_ptr)0x0) {
            p_Var3 = local_a0._M_buckets[uVar8 % local_a0._M_bucket_count]->_M_nxt;
            uVar2 = *(uint *)&p_Var3[1]._M_nxt;
            do {
              if ((uint)uVar8 == uVar2) goto LAB_005c1429;
              p_Var3 = p_Var3->_M_nxt;
            } while ((p_Var3 != (_Hash_node_base *)0x0) &&
                    (uVar2 = *(uint *)&p_Var3[1]._M_nxt,
                    (ulong)uVar2 % local_a0._M_bucket_count == uVar8 % local_a0._M_bucket_count));
          }
          RegionRegisterLiveness::AddRegisterClass(loop_reg_pressure,pIVar11);
        }
LAB_005c1429:
      }
      p_Var13 = p_Var13->_M_nxt;
    } while (p_Var13 != (_Hash_node_base *)0x0);
  }
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_a0);
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_68);
  return;
}

Assistant:

void RegisterLiveness::ComputeLoopRegisterPressure(
    const Loop& loop, RegionRegisterLiveness* loop_reg_pressure) const {
  loop_reg_pressure->Clear();

  const RegionRegisterLiveness* header_live_inout = Get(loop.GetHeaderBlock());
  loop_reg_pressure->live_in_ = header_live_inout->live_in_;

  std::unordered_set<uint32_t> exit_blocks;
  loop.GetExitBlocks(&exit_blocks);

  for (uint32_t bb_id : exit_blocks) {
    const RegionRegisterLiveness* live_inout = Get(bb_id);
    loop_reg_pressure->live_out_.insert(live_inout->live_in_.begin(),
                                        live_inout->live_in_.end());
  }

  std::unordered_set<uint32_t> seen_insn;
  for (Instruction* insn : loop_reg_pressure->live_out_) {
    loop_reg_pressure->AddRegisterClass(insn);
    seen_insn.insert(insn->result_id());
  }
  for (Instruction* insn : loop_reg_pressure->live_in_) {
    if (!seen_insn.count(insn->result_id())) {
      continue;
    }
    loop_reg_pressure->AddRegisterClass(insn);
    seen_insn.insert(insn->result_id());
  }

  loop_reg_pressure->used_registers_ = 0;

  for (uint32_t bb_id : loop.GetBlocks()) {
    BasicBlock* bb = context_->cfg()->block(bb_id);

    const RegionRegisterLiveness* live_inout = Get(bb_id);
    assert(live_inout != nullptr && "Basic block not processed");
    loop_reg_pressure->used_registers_ = std::max(
        loop_reg_pressure->used_registers_, live_inout->used_registers_);

    for (Instruction& insn : *bb) {
      if (insn.opcode() == spv::Op::OpPhi || !CreatesRegisterUsage(&insn) ||
          seen_insn.count(insn.result_id())) {
        continue;
      }
      loop_reg_pressure->AddRegisterClass(&insn);
    }
  }
}